

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk94(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk94_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk94.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk94.version);
    if ((bios->power).unk94.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk94.offset + 1,&(bios->power).unk94.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk94.offset + 2,&(bios->power).unk94.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk94.offset + 3,&(bios->power).unk94.entriesnum);
      (bios->power).unk94.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk94.entriesnum;
      peVar5 = (envy_bios_power_unk94_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk94.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk94.rlen * (int)uVar6 +
             (uint)(bios->power).unk94.hlen + (bios->power).unk94.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown THERM MONITOR table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk94(struct envy_bios *bios) {
	struct envy_bios_power_unk94 *unk94 = &bios->power.unk94;
	int i, err = 0;

	if (!unk94->offset)
		return -EINVAL;

	bios_u8(bios, unk94->offset + 0x0, &unk94->version);
	switch(unk94->version) {
	case 0x10:
		err |= bios_u8(bios, unk94->offset + 0x1, &unk94->hlen);
		err |= bios_u8(bios, unk94->offset + 0x2, &unk94->rlen);
		err |= bios_u8(bios, unk94->offset + 0x3, &unk94->entriesnum);
		unk94->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERM MONITOR table version 0x%x\n", unk94->version);
		return -EINVAL;
	};

	err = 0;
	unk94->entries = malloc(unk94->entriesnum * sizeof(struct envy_bios_power_unk94_entry));
	for (i = 0; i < unk94->entriesnum; i++) {
		uint32_t data = unk94->offset + unk94->hlen + i * unk94->rlen;

		unk94->entries[i].offset = data;
	}

	return 0;
}